

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O0

void __thiscall
cppcms::impl::cgi::connection::cgi_forwarder::on_connected(cgi_forwarder *this,error_code *e)

{
  bool bVar1;
  element_type *peVar2;
  error_code *in_RSI;
  long in_RDI;
  string *d;
  size_t in_stack_00000030;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000038;
  enable_shared_from_this<cppcms::impl::cgi::connection::cgi_forwarder> *in_stack_ffffffffffffff38;
  string *this_00;
  offset_in_cgi_forwarder_to_subr in_stack_ffffffffffffff70;
  callback local_60 [48];
  string local_30 [48];
  
  bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
  if (!bVar1) {
    peVar2 = std::
             __shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x381dba);
    (*peVar2->_vptr_connection[2])();
    this_00 = local_30;
    make_scgi_header(in_stack_00000038,in_stack_00000030);
    d = (string *)(in_RDI + 0x60);
    std::__cxx11::string::operator=((string *)d,this_00);
    std::__cxx11::string::~string(this_00);
    booster::aio::buffer(d);
    std::enable_shared_from_this<cppcms::impl::cgi::connection::cgi_forwarder>::shared_from_this
              (in_stack_ffffffffffffff38);
    mfunc_to_io_handler<cppcms::impl::cgi::connection::cgi_forwarder,std::shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder>>
              (in_stack_ffffffffffffff70,
               (shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder> *)0x0);
    booster::callback<void(std::error_code_const&,unsigned_long)>::
    callback<booster::callable<void(std::error_code_const&,unsigned_long)>>
              ((callback<void_(const_std::error_code_&,_unsigned_long)> *)this_00,
               (intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> *)
               in_stack_ffffffffffffff38);
    booster::aio::stream_socket::async_write((const_buffer *)(in_RDI + 0x20),local_60);
    booster::callback<void_(const_std::error_code_&,_unsigned_long)>::~callback
              ((callback<void_(const_std::error_code_&,_unsigned_long)> *)0x381e90);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
    ~intrusive_ptr((intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>
                    *)this_00);
    std::shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder>::~shared_ptr
              ((shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder> *)0x381ea4);
    booster::aio::const_buffer::~const_buffer((const_buffer *)0x381eae);
  }
  return;
}

Assistant:

void on_connected(booster::system::error_code const &e)
		{
			if(e) return;
			header_ = make_scgi_header(conn_->getenv(),0);
			scgi_.async_write(
				booster::aio::buffer(header_),
				mfunc_to_io_handler(&cgi_forwarder::on_header_sent,shared_from_this()));
		}